

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecUnary(Parser *this,string *msg,bool emptyAllowed)

{
  undefined8 uVar1;
  bool bVar2;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  undefined1 local_b0 [32];
  optional<enact::Token> permission;
  optional<enact::Token> region;
  
  bVar2 = consume((Parser *)msg,AMPERSAND);
  if (bVar2) {
    permission.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    bVar2 = consume((Parser *)msg,MUT);
    if ((bVar2) || (bVar2 = consume((Parser *)msg,IMM), bVar2)) {
      std::optional<enact::Token>::operator=(&permission,(Token *)&msg[5].field_2);
    }
    region.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    bVar2 = consume((Parser *)msg,SO);
    if (((bVar2) || (bVar2 = consume((Parser *)msg,RC), bVar2)) ||
       (bVar2 = consume((Parser *)msg,GC), bVar2)) {
      std::optional<enact::Token>::operator=(&region,(Token *)&msg[5].field_2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"Expected typename after \'&\'.",&local_b9);
    expectTypenamePrecUnary((Parser *)local_b8,msg,SUB81(local_b0,0));
    std::__cxx11::string::~string((string *)local_b0);
    std::
    make_unique<enact::ReferenceTypename,std::optional<enact::Token>,std::optional<enact::Token>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
              ((optional<enact::Token> *)local_b0,&permission,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &region);
    this->m_context = (CompileContext *)local_b0._0_8_;
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_b8)->_M_dataplus)._M_p + 8))();
    }
    std::_Optional_payload_base<enact::Token>::_M_reset
              ((_Optional_payload_base<enact::Token> *)&region);
    std::_Optional_payload_base<enact::Token>::_M_reset
              ((_Optional_payload_base<enact::Token> *)&permission);
    return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
              )this;
  }
  bVar2 = consume((Parser *)msg,QUESTION);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&permission,"Expected typename after \'?\'.",(allocator<char> *)local_b8);
    expectTypenamePrecUnary((Parser *)local_b0,msg,SUB81(&permission,0));
    std::
    make_unique<enact::OptionalTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &region);
    uVar1 = region.super__Optional_base<enact::Token,_false,_false>._M_payload.
            super__Optional_payload<enact::Token,_true,_false,_false>.
            super__Optional_payload_base<enact::Token>._M_payload._0_8_;
    region.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_payload._0_8_ = 0;
    this->m_context = (CompileContext *)uVar1;
    if ((CompileContext *)local_b0._0_8_ != (CompileContext *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
    local_b0._0_8_ = (pointer)0x0;
    std::__cxx11::string::~string((string *)&permission);
    return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
              )this;
  }
  expectTypenamePrecParametric(this,msg,emptyAllowed);
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecUnary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::AMPERSAND)) {
            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<const Typename> referringTypename = expectTypenamePrecUnary("Expected typename after '&'.");

            return std::make_unique<ReferenceTypename>(
                    std::move(permission),
                    std::move(region),
                    std::move(referringTypename));
        }
        if (consume(TokenType::QUESTION)) {
            return std::make_unique<OptionalTypename>(expectTypenamePrecUnary("Expected typename after '?'."));
        }

        return expectTypenamePrecParametric(msg, emptyAllowed);
    }